

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SquareMatrix.hpp
# Opt level: O0

SquareMatrix<std::complex<float>_> * __thiscall
qclab::dense::SquareMatrix<std::complex<float>_>::operator+=
          (SquareMatrix<std::complex<float>_> *this,SquareMatrix<std::complex<float>_> *rhs)

{
  int64_t iVar1;
  complex<float> *__z;
  complex<float> *this_00;
  long local_28;
  int64_t i;
  int64_t j;
  SquareMatrix<std::complex<float>_> *rhs_local;
  SquareMatrix<std::complex<float>_> *this_local;
  
  iVar1 = size(rhs);
  if (iVar1 == this->size_) {
    for (i = 0; i < this->size_; i = i + 1) {
      for (local_28 = 0; local_28 < this->size_; local_28 = local_28 + 1) {
        __z = operator()(rhs,local_28,i);
        this_00 = operator()(this,local_28,i);
        std::complex<float>::operator+=(this_00,__z);
      }
    }
    return this;
  }
  __assert_fail("rhs.size() == size_",
                "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/include/qclab/dense/SquareMatrix.hpp"
                ,0x98,
                "SquareMatrix<T> &qclab::dense::SquareMatrix<std::complex<float>>::operator+=(const SquareMatrix<T> &) [T = std::complex<float>]"
               );
}

Assistant:

inline SquareMatrix< T >& operator+=( const SquareMatrix< T >& rhs ) {
          assert( rhs.size() == size_ ) ;
          #pragma omp parallel for
          for ( int64_t j = 0; j < size_; j++ ) {
            for ( int64_t i = 0; i < size_; i++ ) {
              (*this)(i,j) += rhs(i,j) ;
            }
          }
          return *this ;
        }